

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::hideOrShow(QStatusBar *this)

{
  QStatusBarPrivate *this_00;
  long lVar1;
  SBItem *pSVar2;
  long lVar3;
  QWidget *this_01;
  bool bVar4;
  char cVar5;
  long lVar6;
  long in_FS_OFFSET;
  QRect local_58;
  QStatusBar *pQStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
  lVar1 = (this_00->tempItem).d.size;
  pSVar2 = (this_00->items).d.ptr;
  lVar3 = (this_00->items).d.size;
  for (lVar6 = 0; (lVar3 << 4 != lVar6 && (*(int *)((long)&pSVar2->category + lVar6) != 1));
      lVar6 = lVar6 + 0x10) {
    this_01 = *(QWidget **)((long)&pSVar2->widget + lVar6);
    if (lVar1 == 0) {
      bVar4 = QWidget::testAttribute_helper(this_01,WA_WState_ExplicitShowHide);
      if (!bVar4) {
        QWidget::show(*(QWidget **)((long)&pSVar2->widget + lVar6));
      }
    }
    else if ((this_01->data->widget_attributes & 0x8000) != 0) {
      QWidget::hide(this_01);
      QWidget::setAttribute
                (*(QWidget **)((long)&pSVar2->widget + lVar6),WA_WState_ExplicitShowHide,false);
    }
  }
  messageChanged(this,&this_00->tempItem);
  cVar5 = QAccessible::isActive();
  if (cVar5 != '\0') {
    local_58.x2.m_i = 0x800c;
    local_58._0_8_ = QFont::strikeOut;
    local_58.y2.m_i = -0x55555556;
    local_40 = 0xaaaaaaaaffffffff;
    pQStack_48 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
  }
  local_58 = QStatusBarPrivate::messageRect(this_00);
  QWidget::update(&this->super_QWidget,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::hideOrShow()
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    for (const auto &item : std::as_const(d->items)) {
        if (item.isPermanent())
            break;
        if (haveMessage && item.widget->isVisible()) {
            item.widget->hide();
            item.widget->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        } else if (!haveMessage && !item.widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
            item.widget->show();
        }
    }

    emit messageChanged(d->tempItem);

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif

    update(d->messageRect());
}